

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverMaxPlus.h
# Opt level: O1

void __thiscall
BGIP_SolverMaxPlus<JointPolicyPureVector>::BGIP_SolverMaxPlus
          (BGIP_SolverMaxPlus<JointPolicyPureVector> *this,
          shared_ptr<const_BayesianGameIdenticalPayoffInterface> *bg,size_t maxiter,
          string *updateType,size_t verbosity,double damping,size_t nrSolutions,size_t nrRestarts)

{
  pointer pcVar1;
  long *local_50 [2];
  long local_40 [2];
  
  BayesianGameIdenticalPayoffSolver::BayesianGameIdenticalPayoffSolver
            ((BayesianGameIdenticalPayoffSolver *)this,(shared_ptr *)bg,1);
  *(undefined ***)&this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> =
       &PTR_InitDeadline_0012bf90;
  pcVar1 = (updateType->_M_dataplus)._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + updateType->_M_string_length);
  MaxPlusSolverForBGs::MaxPlusSolverForBGs
            ((MaxPlusSolverForBGs *)damping,&this->super_MaxPlusSolverForBGs,maxiter,local_50,
             verbosity & 0xffffffff,nrSolutions,nrRestarts);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  *(undefined ***)&this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVector> =
       &PTR_InitDeadline_0012ca58;
  return;
}

Assistant:

BGIP_SolverMaxPlus(
            const boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> &bg,
            size_t maxiter = 1000,
            std::string updateType=std::string("PARALL"),
            size_t verbosity = 2,
            double damping = 0.0,
            size_t nrSolutions = 1,
            size_t nrRestarts = 1
        ) :
        BayesianGameIdenticalPayoffSolver_T<JP>(bg),
        MaxPlusSolverForBGs(maxiter, updateType, verbosity, damping, nrSolutions, nrRestarts)
        {}